

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_input_tls12(ptls_t *tls,ptls_buffer_t *decryptbuf,void *input,size_t *inlen)

{
  uint8_t *end_00;
  size_t delta;
  size_t sVar1;
  size_t textlen;
  uint8_t aad [13];
  uint64_t nonce;
  uint8_t *end;
  uint8_t *src;
  undefined1 local_48 [4];
  int ret;
  st_ptls_record_t rec;
  size_t *inlen_local;
  void *input_local;
  ptls_buffer_t *decryptbuf_local;
  ptls_t *tls_local;
  
  rec.fragment = (uint8_t *)inlen;
  src._4_4_ = parse_record(tls,(st_ptls_record_t *)local_48,(uint8_t *)input,inlen);
  if (src._4_4_ != 0) {
    return src._4_4_;
  }
  if (rec.length == 0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x1743,
                  "int handle_input_tls12(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
  }
  end = (uint8_t *)rec.length;
  end_00 = (uint8_t *)(rec.length + rec._0_8_);
  if ((((tls->traffic_protection).dec.aead)->algo->tls12).record_iv_size == 0) {
    aad._5_8_ = (tls->traffic_protection).dec.seq;
  }
  else {
    if ((((tls->traffic_protection).dec.aead)->algo->tls12).record_iv_size != 8) {
      __assert_fail("tls->traffic_protection.dec.aead->algo->tls12.record_iv_size == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x174b,
                    "int handle_input_tls12(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
    }
    src._4_4_ = ptls_decode64((uint64_t *)(aad + 5),&end,end_00);
    if (src._4_4_ != 0) goto LAB_0011c70a;
  }
  src._4_4_ = 0;
  if ((ulong)((long)end_00 - (long)end) < ((tls->traffic_protection).dec.aead)->algo->tag_size) {
    src._4_4_ = 0x14;
  }
  else {
    delta = ((long)end_00 - (long)end) - ((tls->traffic_protection).dec.aead)->algo->tag_size;
    build_tls12_aad((uint8_t *)((long)&textlen + 3),local_48[0],(tls->traffic_protection).dec.seq,
                    (uint16_t)delta);
    src._4_4_ = ptls_buffer_reserve(decryptbuf,delta);
    if (src._4_4_ == 0) {
      sVar1 = ptls_aead_decrypt((tls->traffic_protection).dec.aead,
                                decryptbuf->base + decryptbuf->off,end,(long)end_00 - (long)end,
                                aad._5_8_,(void *)((long)&textlen + 3),0xd);
      if (sVar1 == delta) {
        (tls->traffic_protection).dec.seq = (tls->traffic_protection).dec.seq + 1;
        if (local_48[0] == '\x15') {
          src._4_4_ = handle_alert(tls,decryptbuf->base + decryptbuf->off,delta);
        }
        else if (local_48[0] == '\x17') {
          decryptbuf->off = delta + decryptbuf->off;
        }
        else {
          src._4_4_ = 10;
        }
      }
      else {
        src._4_4_ = 0x14;
      }
    }
  }
LAB_0011c70a:
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  (*ptls_clear_memory)((void *)((long)&textlen + 3),0xd);
  return 0;
}

Assistant:

static int handle_input_tls12(ptls_t *tls, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record, or bail out */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    const uint8_t *src = rec.fragment, *end = src + rec.length;
    uint64_t nonce;
    uint8_t aad[PTLS_TLS12_AAD_SIZE];

    /* determine the nonce */
    if (tls->traffic_protection.dec.aead->algo->tls12.record_iv_size != 0) {
        assert(tls->traffic_protection.dec.aead->algo->tls12.record_iv_size == 8);
        if ((ret = ptls_decode64(&nonce, &src, end)) != 0)
            goto Exit;
    } else {
        nonce = tls->traffic_protection.dec.seq;
    }

    /* determine cleartext length */
    size_t textlen = end - src;
    if (textlen < tls->traffic_protection.dec.aead->algo->tag_size) {
        ret = PTLS_ALERT_BAD_RECORD_MAC;
        goto Exit;
    }
    textlen -= tls->traffic_protection.dec.aead->algo->tag_size;

    /* build aad */
    build_tls12_aad(aad, rec.type, tls->traffic_protection.dec.seq, (uint16_t)textlen);

    /* decrypt input to decryptbuf */
    if ((ret = ptls_buffer_reserve(decryptbuf, textlen)) != 0)
        goto Exit;
    if (ptls_aead_decrypt(tls->traffic_protection.dec.aead, decryptbuf->base + decryptbuf->off, src, end - src, nonce, aad,
                          sizeof(aad)) != textlen) {
        ret = PTLS_ALERT_BAD_RECORD_MAC;
        goto Exit;
    }
    ++tls->traffic_protection.dec.seq;

    /* record-type specific action */
    switch (rec.type) {
    case PTLS_CONTENT_TYPE_APPDATA:
        /* if application data, retain the bytes being decrypted */
        decryptbuf->off += textlen;
        break;
    case PTLS_CONTENT_TYPE_ALERT:
        /* submit alert without adjusting decryptbuf, so that the decrypted data would be dropped after handling the alert */
        ret = handle_alert(tls, decryptbuf->base + decryptbuf->off, textlen);
        break;
    default:
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        break;
    }

Exit:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    ptls_clear_memory(aad, sizeof(aad));
    return 0;
}